

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

char * tinyexr::ReadString(string *s,char *ptr,size_t len)

{
  ulong in_RDX;
  allocator<char> *in_RSI;
  string *in_RDI;
  char *q;
  char *p;
  allocator<char> *__a;
  allocator<char> *__end;
  uint in_stack_ffffffffffffff98;
  uint uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [32];
  allocator<char> *local_30;
  string *local_10;
  allocator<char> *local_8;
  
  local_30 = in_RSI;
  while( true ) {
    uVar1 = in_stack_ffffffffffffff98 & 0xffffff;
    if ((ulong)((long)local_30 - (long)in_RSI) < in_RDX) {
      uVar1 = CONCAT13(*local_30 != (allocator<char>)0x0,(int3)in_stack_ffffffffffffff98);
    }
    if ((char)(uVar1 >> 0x18) == '\0') break;
    local_30 = local_30 + 1;
    in_stack_ffffffffffffff98 = uVar1;
  }
  if ((ulong)((long)local_30 - (long)in_RSI) < in_RDX) {
    __end = &local_51;
    __a = local_30;
    local_10 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_stack_ffffffffffffffa0,(char *)CONCAT44(in_stack_ffffffffffffff9c,uVar1),
               (char *)__end,__a);
    std::__cxx11::string::operator=(local_10,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    local_8 = local_30 + 1;
  }
  else {
    std::__cxx11::string::clear();
    local_8 = (allocator<char> *)0x0;
  }
  return (char *)local_8;
}

Assistant:

static const char *ReadString(std::string *s, const char *ptr, size_t len) {
  // Read untile NULL(\0).
  const char *p = ptr;
  const char *q = ptr;
  while ((size_t(q - ptr) < len) && (*q) != 0) {
    q++;
  }

  if (size_t(q - ptr) >= len) {
    (*s).clear();
    return NULL;
  }

  (*s) = std::string(p, q);

  return q + 1;  // skip '\0'
}